

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O3

int trdmain(int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  int iVar1;
  uint uVar2;
  osfildef *fp;
  ulong uVar3;
  char *pcVar4;
  errdef fr_;
  errcxdef errctx;
  errdef local_3b0;
  errcxdef local_278;
  
  local_278.errcxlog = trdlogerr;
  local_278.errcxfp = (osfildef *)0x0;
  local_278.errcxofs = 0;
  local_278.errcxlgc = &local_278;
  local_278.errcxappctx = appctx;
  fp = oserrop(*argv);
  errini(&local_278,fp);
  if (1 < argc) {
    uVar3 = 1;
    do {
      iVar1 = strcmp(argv[uVar3],"-nobanner");
      if (iVar1 == 0) goto LAB_001e8c0b;
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  trdptf("%s - A %s TADS %s Interpreter.\n",G_tads_oem_app_name,G_tads_oem_display_mode,"2.5.17");
  pcVar4 = "TADS c";
  if (G_tads_oem_copyright_prefix == 0) {
    pcVar4 = "C";
  }
  trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",pcVar4);
  trdptf("%s\n",G_tads_oem_author);
LAB_001e8c0b:
  iVar1 = _setjmp((__jmp_buf_tag *)local_3b0.errbuf);
  local_3b0.errcode = iVar1;
  if (iVar1 == 0) {
    local_3b0.errprv = local_278.errcxptr;
    local_278.errcxptr = &local_3b0;
    trdmain1(&local_278,argc,argv,appctx,save_ext);
    local_278.errcxptr = local_3b0.errprv;
    if ((FILE *)local_278.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_278.errcxfp);
    }
    close_log_files();
    uVar2 = 0;
  }
  else {
    local_278.errcxptr = local_3b0.errprv;
    if ((iVar1 != 0x3f9) && (iVar1 != 0x5dc)) {
      (*local_278.errcxlog)
                (local_278.errcxlgc,local_3b0.errfac,iVar1,local_3b0.erraac,local_3b0.erraav);
    }
    if ((FILE *)local_278.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_278.errcxfp);
    }
    close_log_files();
    os_expause();
    uVar2 = (uint)(iVar1 != 0x3f9);
  }
  return uVar2;
}

Assistant:

int trdmain(int argc, char *argv[], appctxdef *appctx, char *save_ext)
{
    errcxdef  errctx;
    int       err;
	osfildef *fp;
	int       banner = TRUE;                            /* show the banner? */
	int       i;

	VARUSED(banner);

	/* set up the error handler */
    errctx.errcxlog = trdlogerr;
    errctx.errcxlgc = &errctx;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxofs = 0;
    errctx.errcxappctx = appctx;
    fp = oserrop(argv[0]);
	errini(&errctx, fp);

	/* check for the -nobanner option */
	for (i = 1 ; i < argc ; ++i)
	{
		if (strcmp(argv[i], "-nobanner") == 0)
		{
			banner = FALSE;
			break;
		}
	}
    
    /* copyright-date-string */
#ifndef NO_T2_COPYRIGHT_NOTICE
	if (banner)
	{
		trdptf("%s - A %s TADS %s Interpreter.\n",
			   G_tads_oem_app_name, G_tads_oem_display_mode,
			   TADS_RUNTIME_VERSION);
		trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",
			   G_tads_oem_copyright_prefix ? "TADS c" : "C");
		trdptf("%s\n", G_tads_oem_author);
	}
#endif
    
    ERRBEGIN(&errctx)
        trdmain1(&errctx, argc, argv, appctx, save_ext);
    ERRCATCH(&errctx, err)
        /* 
         *   log the error, unless it's usage (in which case we logged it
         *   already) or we're simply quitting the game 
         */
        if (err != ERR_USAGE && err != ERR_RUNQUIT)
            errclog(&errctx);
    
        /* close the error file */
        if (errctx.errcxfp != 0)
			osfcls(errctx.errcxfp);

		/* close the command and log files, if open */
		close_log_files();

        /* pause before exiting if the OS desires it */
        os_expause();

        /* return failure unless we're simply quitting the game */
        return (err == ERR_RUNQUIT ? OSEXSUCC : OSEXFAIL);
    ERREND(&errctx)
        
    /* close the error file if we opened it */
    if (errctx.errcxfp != 0)
        osfcls(errctx.errcxfp);
	
	/* close the command and log files, if open */
	close_log_files();

    /* successful completion */
    return(OSEXSUCC);
}